

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

void __thiscall leveldb::Status::Status(Status *this,Code code,Slice *msg,Slice *msg2)

{
  long lVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  int in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char *result;
  uint32_t len2;
  uint32_t len1;
  uint32_t size;
  Slice *in_stack_ffffffffffffff98;
  int local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    __assert_fail("code != kOk",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/status.cc"
                  ,0x16,"leveldb::Status::Status(Code, const Slice &, const Slice &)");
  }
  sVar4 = Slice::size(in_stack_ffffffffffffff98);
  iVar2 = (int)sVar4;
  sVar5 = Slice::size(in_stack_ffffffffffffff98);
  iVar3 = (int)sVar5;
  if (iVar3 == 0) {
    local_50 = 0;
  }
  else {
    local_50 = iVar3 + 2;
  }
  piVar6 = (int *)operator_new__((ulong)(iVar2 + local_50 + 5));
  *piVar6 = iVar2 + local_50;
  *(char *)(piVar6 + 1) = (char)in_ESI;
  pcVar7 = Slice::data(in_stack_ffffffffffffff98);
  memcpy((void *)((long)piVar6 + 5),pcVar7,sVar4 & 0xffffffff);
  if (iVar3 != 0) {
    *(undefined1 *)((long)piVar6 + (ulong)(iVar2 + 5)) = 0x3a;
    *(undefined1 *)((long)piVar6 + (ulong)(iVar2 + 6)) = 0x20;
    pcVar7 = Slice::data(in_stack_ffffffffffffff98);
    memcpy((void *)((long)piVar6 + (sVar4 & 0xffffffff) + 7),pcVar7,sVar5 & 0xffffffff);
  }
  *in_RDI = piVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Status::Status(Code code, const Slice& msg, const Slice& msg2) {
  assert(code != kOk);
  const uint32_t len1 = static_cast<uint32_t>(msg.size());
  const uint32_t len2 = static_cast<uint32_t>(msg2.size());
  const uint32_t size = len1 + (len2 ? (2 + len2) : 0);
  char* result = new char[size + 5];
  memcpy(result, &size, sizeof(size));
  result[4] = static_cast<char>(code);
  memcpy(result + 5, msg.data(), len1);
  if (len2) {
    result[5 + len1] = ':';
    result[6 + len1] = ' ';
    memcpy(result + 7 + len1, msg2.data(), len2);
  }
  state_ = result;
}